

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void place_wsegs(monst *worm)

{
  ulong uVar1;
  level *plVar2;
  wseg *pwVar3;
  
  uVar1 = (ulong)worm->wormno;
  if (uVar1 != 0) {
    plVar2 = worm->dlevel;
    pwVar3 = (wseg *)(plVar2->wtails + uVar1);
    while (pwVar3 = pwVar3->nseg, pwVar3 != plVar2->wheads[uVar1]) {
      plVar2->monsters[pwVar3->wx][pwVar3->wy] = worm;
      plVar2 = worm->dlevel;
    }
    return;
  }
  warning("place_wsegs: worm->wormno was 0");
  return;
}

Assistant:

void place_wsegs(struct monst *worm)
{
    struct wseg *curr = worm->dlevel->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("place_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != worm->dlevel->wheads[worm->wormno]) {
	place_worm_seg(worm, curr->wx, curr->wy);
	curr = curr->nseg;
    }
}